

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

double __thiscall ON_PolyCurve::SegmentCurveParameter(ON_PolyCurve *this,double polycurve_parameter)

{
  ON_Curve *pOVar1;
  bool bVar2;
  uint segment_index;
  double dVar3;
  ON_Interval sdom;
  ON_Interval cdom;
  ON_Interval local_38;
  ON_Interval local_28;
  
  segment_index = SegmentIndex(this,polycurve_parameter);
  dVar3 = -1.23432101234321e+308;
  if (((-1 < (int)segment_index) &&
      ((int)segment_index < (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count)) &&
     (pOVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[segment_index],
     pOVar1 != (ON_Curve *)0x0)) {
    (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
    local_38 = SegmentDomain(this,segment_index);
    bVar2 = ON_Interval::operator==(&local_28,&local_38);
    dVar3 = polycurve_parameter;
    if (!bVar2) {
      dVar3 = ON_Interval::NormalizedParameterAt(&local_38,polycurve_parameter);
      dVar3 = ON_Interval::ParameterAt(&local_28,dVar3);
    }
  }
  return dVar3;
}

Assistant:

double ON_PolyCurve::SegmentCurveParameter(
  double polycurve_parameter
  ) const
{
  int segment_index = SegmentIndex( polycurve_parameter );
  const ON_Curve* segment_curve = SegmentCurve(segment_index);
  if ( !segment_curve )
    return ON_UNSET_VALUE;
  ON_Interval cdom = segment_curve->Domain();
  ON_Interval sdom = SegmentDomain(segment_index);
  if ( cdom == sdom )
    return polycurve_parameter;
  double s = sdom.NormalizedParameterAt(polycurve_parameter);
  return cdom.ParameterAt(s);
}